

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

bool __thiscall Memory::HeapBlockMap32::TestAndSetMark(HeapBlockMap32 *this,void *address)

{
  BOOLEAN BVar1;
  
  if (this->map[(ulong)address >> 0x14 & 0xfff] != (L2MapChunk *)0x0) {
    BVar1 = BVStatic<65536UL>::TestAndSet
                      (&this->map[(ulong)address >> 0x14 & 0xfff]->markBits,
                       (uint)address >> 4 & 0xffff);
    return BVar1 != '\0';
  }
  return false;
}

Assistant:

bool
HeapBlockMap32::TestAndSetMark(void * address)
{
    uint id1 = GetLevel1Id(address);

    L2MapChunk * chunk = map[id1];
    if (chunk == nullptr)
    {
        // False reference
        return false;
    }

    uint bitIndex = chunk->GetMarkBitIndex(address);
    return (chunk->markBits.TestAndSet(bitIndex) != 0);
}